

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uchar *puVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int itemsize;
  int iVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  undefined8 extraout_RDX;
  ulong uVar13;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  uint uVar15;
  undefined4 in_register_00000034;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  uchar **hash_table [16384];
  int iStack_20088;
  uint uStack_20084;
  uchar *puStack_20080;
  ulong uStack_20078;
  uchar *puStack_20070;
  int iStack_20068;
  int iStack_20064;
  ulong uStack_20060;
  ulong uStack_20058;
  int *piStack_20050;
  size_t sStack_20048;
  ulong uStack_20040;
  void *apvStack_20038 [16385];
  
  uStack_20078 = CONCAT44(in_register_00000034,data_len);
  puStack_20080 = (uchar *)0x0;
  uStack_20060 = 5;
  if (5 < quality) {
    uStack_20060 = (ulong)(uint)quality;
  }
  piStack_20050 = out_len;
  stbiw__sbgrowf(&puStack_20080,1,(int)out_len);
  iVar12 = *(int *)(puStack_20080 + -4);
  *(int *)(puStack_20080 + -4) = iVar12 + 1;
  puStack_20080[iVar12] = 'x';
  iVar20 = *(int *)(puStack_20080 + -4);
  iVar12 = iVar20 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar12) {
    stbiw__sbgrowf(&puStack_20080,1,itemsize);
    iVar20 = *(int *)(puStack_20080 + -4);
    iVar12 = iVar20 + 1;
  }
  *(int *)(puStack_20080 + -4) = iVar12;
  puStack_20080[iVar20] = '^';
  uStack_20084 = 1;
  iStack_20088 = 1;
  puVar6 = stbiw__zlib_flushf(puStack_20080,&uStack_20084,&iStack_20088);
  uStack_20084 = uStack_20084 | 1 << ((byte)iStack_20088 & 0x1f);
  iStack_20088 = iStack_20088 + 2;
  puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
  uVar8 = 0;
  puStack_20080 = puVar6;
  memset(apvStack_20038,0,0x20000);
  iVar12 = (int)uStack_20078;
  if (3 < iVar12) {
    iStack_20064 = iVar12 + -3;
    iStack_20068 = (int)uStack_20060 * 2;
    uStack_20040 = uStack_20060 & 0xffffffff;
    sStack_20048 = uStack_20040 * 8;
    uVar19 = 0;
    uVar14 = extraout_RDX;
    do {
      iVar12 = (int)uVar14;
      iVar20 = (int)uVar19;
      pbVar1 = data + iVar20;
      uVar8 = (uint)CONCAT12(data[(long)iVar20 + 2],*(undefined2 *)(data + iVar20)) * 8 ^
              (uint)CONCAT12(data[(long)iVar20 + 2],*(undefined2 *)(data + iVar20));
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = (uVar8 >> 6) + uVar8 & 0x3fff;
      pvVar21 = apvStack_20038[uVar8];
      puStack_20070 = puVar6;
      uStack_20058 = uVar19;
      if (pvVar21 == (void *)0x0) {
        iVar10 = 3;
        lVar22 = 0;
LAB_0010af22:
        stbiw__sbgrowf(apvStack_20038 + uVar8,8,iVar12);
        pvVar21 = apvStack_20038[uVar8];
        iVar20 = *(int *)((long)pvVar21 + -4);
        iVar9 = iVar20 + 1;
      }
      else {
        if ((long)*(int *)((long)pvVar21 + -4) < 1) {
          iVar10 = 3;
          lVar22 = 0;
        }
        else {
          iVar12 = (int)uStack_20078 - iVar20;
          uVar15 = iVar12 - 1;
          if (0x100 < uVar15) {
            uVar15 = 0x101;
          }
          iVar10 = 3;
          lVar17 = 0;
          lVar22 = 0;
          do {
            lVar3 = *(long *)((long)pvVar21 + lVar17 * 8);
            if ((long)(iVar20 + -0x8000) < lVar3 - (long)data) {
              uVar19 = 0;
              if (0 < iVar12) {
                do {
                  if (*(byte *)(lVar3 + uVar19) != pbVar1[uVar19]) goto LAB_0010aebf;
                  uVar19 = uVar19 + 1;
                } while (uVar15 + 1 != uVar19);
                uVar19 = (ulong)(uVar15 + 1);
              }
LAB_0010aebf:
              iVar18 = (int)uVar19;
              iVar9 = iVar10;
              if (iVar10 < iVar18) {
                iVar9 = iVar18;
              }
              bVar4 = iVar10 <= iVar18;
              iVar10 = iVar9;
              if (bVar4) {
                lVar22 = lVar3;
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != *(int *)((long)pvVar21 + -4));
          if (pvVar21 == (void *)0x0) goto LAB_0010af22;
        }
        iVar20 = *(int *)((long)pvVar21 + -4);
        if (iVar20 == iStack_20068) {
          memmove(pvVar21,(void *)(uStack_20040 * 8 + (long)pvVar21),sStack_20048);
          iVar20 = (int)uStack_20060;
          *(int *)((long)pvVar21 + -4) = iVar20;
          iVar12 = extraout_EDX;
        }
        iVar9 = iVar20 + 1;
        if (*(int *)((long)pvVar21 + -8) <= iVar9) goto LAB_0010af22;
      }
      *(int *)((long)pvVar21 + -4) = iVar9;
      *(byte **)((long)pvVar21 + (long)iVar20 * 8) = pbVar1;
      iVar12 = (int)uStack_20078;
      bVar7 = (byte)iStack_20088;
      if (lVar22 == 0) {
LAB_0010b066:
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar8 = bVar2 + 0x30;
          iVar20 = 0;
          iVar10 = -8;
          do {
            iVar20 = (uVar8 & 1) + iVar20 * 2;
            uVar8 = uVar8 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar8 = iVar20 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 8;
        }
        else {
          uVar8 = bVar2 | 0x100;
          iVar20 = 0;
          iVar10 = -9;
          do {
            iVar20 = (uVar8 & 1) + iVar20 * 2;
            uVar8 = uVar8 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar8 = iVar20 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 9;
        }
        uStack_20084 = uStack_20084 | uVar8;
        iVar10 = 1;
        puVar6 = puStack_20070;
LAB_0010b1ec:
        puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        uVar14 = extraout_RDX_01;
      }
      else {
        uVar8 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar8 = (uVar8 >> 5) + uVar8;
        uVar8 = uVar8 * 0x10 ^ uVar8;
        uVar8 = (uVar8 >> 0x11) + uVar8;
        pvVar21 = apvStack_20038[(uVar8 >> 6) + uVar8 & 0x3fff];
        if ((pvVar21 != (void *)0x0) && (0 < (long)*(int *)((long)pvVar21 + -4))) {
          uVar15 = ~(uint)uStack_20058;
          uVar8 = (uVar15 + iVar12) - 1;
          if (0x100 < uVar8) {
            uVar8 = 0x101;
          }
          lVar17 = 0;
          do {
            lVar3 = *(long *)((long)pvVar21 + lVar17 * 8);
            if ((long)(int)((uint)uStack_20058 - 0x7fff) < lVar3 - (long)data) {
              uVar19 = 0;
              if (0 < (int)(uVar15 + iVar12)) {
                do {
                  if (*(byte *)(lVar3 + uVar19) != pbVar1[uVar19 + 1]) goto LAB_0010b00c;
                  uVar19 = uVar19 + 1;
                } while (uVar8 + 1 != uVar19);
                uVar19 = (ulong)(uVar8 + 1);
              }
LAB_0010b00c:
              if (iVar10 < (int)uVar19) goto LAB_0010b066;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != *(int *)((long)pvVar21 + -4));
        }
        iVar20 = (int)pbVar1 - (int)lVar22;
        uVar19 = 0;
        do {
          uVar13 = uVar19;
          uVar19 = uVar13 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar13 + 1] <= iVar10);
        if (uVar13 < 0x17) {
          iVar12 = 0;
          iVar9 = -7;
          do {
            iVar12 = ((uint)uVar19 & 1) + iVar12 * 2;
            uVar19 = (ulong)((uint)uVar19 >> 1);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar8 = iVar12 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 7;
        }
        else {
          uVar8 = (int)uVar19 + 0xa8;
          iVar12 = 0;
          iVar9 = -8;
          do {
            iVar12 = (uVar8 & 1) + iVar12 * 2;
            uVar8 = uVar8 >> 1;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
          uVar8 = iVar12 << (bVar7 & 0x1f);
          iStack_20088 = iStack_20088 + 8;
        }
        uStack_20084 = uStack_20084 | uVar8;
        puVar6 = stbiw__zlib_flushf(puStack_20070,&uStack_20084,&iStack_20088);
        uVar13 = uVar13 & 0xffffffff;
        if (0xffffffffffffffeb < uVar13 - 0x1c) {
          uStack_20084 = uStack_20084 |
                         iVar10 - (uint)stbi_zlib_compress::lengthc[uVar13] <<
                         ((byte)iStack_20088 & 0x1f);
          iStack_20088 = (uint)""[uVar13] + iStack_20088;
          puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        }
        uVar19 = 0xffffffffffffffff;
        do {
          lVar22 = uVar19 + 2;
          uVar19 = uVar19 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar22] <= iVar20);
        iVar12 = 0;
        iVar9 = -5;
        uVar13 = uVar19 & 0xffffffff;
        do {
          iVar12 = ((uint)uVar13 & 1) + iVar12 * 2;
          uVar13 = uVar13 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uStack_20084 = uStack_20084 | iVar12 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 5;
        puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
        iVar12 = (int)uStack_20078;
        uVar14 = extraout_RDX_00;
        if (3 < uVar19) {
          uStack_20084 = uStack_20084 |
                         iVar20 - (uint)stbi_zlib_compress::distc[uVar19 & 0xffffffff] <<
                         ((byte)iStack_20088 & 0x1f);
          iStack_20088 = (uint)""[uVar19 & 0xffffffff] + iStack_20088;
          goto LAB_0010b1ec;
        }
      }
      uVar8 = iVar10 + (int)uStack_20058;
      uVar19 = (ulong)uVar8;
    } while ((int)uVar8 < iStack_20064);
  }
  if ((int)uVar8 < iVar12) {
    lVar22 = (long)(int)uVar8;
    puStack_20080 = puVar6;
    do {
      bVar7 = data[lVar22];
      if (bVar7 < 0x90) {
        uVar8 = bVar7 + 0x30;
        iVar20 = 0;
        iVar10 = -8;
        do {
          iVar20 = (uVar8 & 1) + iVar20 * 2;
          uVar8 = uVar8 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        uVar8 = iVar20 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 8;
      }
      else {
        uVar8 = bVar7 | 0x100;
        iVar20 = 0;
        iVar10 = -9;
        do {
          iVar20 = (uVar8 & 1) + iVar20 * 2;
          uVar8 = uVar8 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        uVar8 = iVar20 << ((byte)iStack_20088 & 0x1f);
        iStack_20088 = iStack_20088 + 9;
      }
      uStack_20084 = uStack_20084 | uVar8;
      puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
      lVar22 = lVar22 + 1;
    } while ((int)lVar22 != iVar12);
  }
  iStack_20088 = iStack_20088 + 7;
  puStack_20080 = puVar6;
  puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
  uVar14 = extraout_RDX_02;
  if (iStack_20088 != 0) {
    do {
      iStack_20088 = iStack_20088 + 1;
      puVar6 = stbiw__zlib_flushf(puVar6,&uStack_20084,&iStack_20088);
      uVar14 = extraout_RDX_03;
    } while (iStack_20088 != 0);
  }
  uVar19 = uStack_20078;
  lVar22 = 0;
  puStack_20080 = puVar6;
  do {
    if (apvStack_20038[lVar22] != (void *)0x0) {
      free((void *)((long)apvStack_20038[lVar22] + -8));
      uVar14 = extraout_RDX_04;
    }
    iVar12 = (int)uVar14;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x4000);
  iVar20 = (int)uVar19;
  if (iVar20 < 1) {
    uVar8 = 0;
    uVar15 = 1;
  }
  else {
    uVar5 = iVar20 + (int)((uVar19 & 0xffffffff) / 0x15b0) * -0x15b0;
    uVar15 = 1;
    uVar11 = 0;
    iVar12 = -0x7ff87f8f;
    uVar8 = 0;
    do {
      if (uVar5 != 0) {
        uVar19 = (ulong)uVar5;
        uVar16 = uVar11;
        do {
          uVar15 = uVar15 + data[uVar16];
          uVar8 = uVar8 + uVar15;
          uVar16 = uVar16 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        uVar15 = uVar15 % 0xfff1;
        uVar8 = uVar8 % 0xfff1;
      }
      uVar11 = uVar11 + uVar5;
      uVar5 = 0x15b0;
    } while ((int)uVar11 < iVar20);
  }
  if (puVar6 != (uchar *)0x0) {
    iVar10 = *(int *)(puVar6 + -4);
    iVar20 = iVar10 + 1;
    if (iVar20 < *(int *)(puVar6 + -8)) goto LAB_0010b3bf;
  }
  stbiw__sbgrowf(&puStack_20080,1,iVar12);
  iVar10 = *(int *)(puStack_20080 + -4);
  iVar20 = iVar10 + 1;
  puVar6 = puStack_20080;
  iVar12 = extraout_EDX_00;
LAB_0010b3bf:
  *(int *)(puVar6 + -4) = iVar20;
  puVar6[iVar10] = (uchar)(uVar8 >> 8);
  if (*(int *)(puVar6 + -8) <= *(int *)(puVar6 + -4) + 1) {
    stbiw__sbgrowf(&puStack_20080,1,iVar12);
    iVar12 = extraout_EDX_01;
  }
  iVar20 = *(int *)(puStack_20080 + -4);
  *(int *)(puStack_20080 + -4) = iVar20 + 1;
  puStack_20080[iVar20] = (uchar)uVar8;
  iVar10 = *(int *)(puStack_20080 + -4);
  iVar20 = iVar10 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar20) {
    stbiw__sbgrowf(&puStack_20080,1,iVar12);
    iVar10 = *(int *)(puStack_20080 + -4);
    iVar20 = iVar10 + 1;
    iVar12 = extraout_EDX_02;
  }
  *(int *)(puStack_20080 + -4) = iVar20;
  puStack_20080[iVar10] = (uchar)(uVar15 >> 8);
  iVar10 = *(int *)(puStack_20080 + -4);
  iVar20 = iVar10 + 1;
  if (*(int *)(puStack_20080 + -8) <= iVar20) {
    stbiw__sbgrowf(&puStack_20080,1,iVar12);
    iVar10 = *(int *)(puStack_20080 + -4);
    iVar20 = iVar10 + 1;
  }
  *(int *)(puStack_20080 + -4) = iVar20;
  puStack_20080[iVar10] = (uchar)uVar15;
  iVar12 = *(int *)(puStack_20080 + -4);
  *piStack_20050 = iVar12;
  puVar6 = (uchar *)memmove(puStack_20080 + -8,puStack_20080,(long)iVar12);
  return puVar6;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}